

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O1

bool __thiscall
nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
          (basic_stackstring<char,_wchar_t,_10UL> *this,input_char_conflict *begin,
          input_char_conflict *end)

{
  bool bVar1;
  basic_stackstring<char,_wchar_t,_10UL> *buffer;
  char *pcVar2;
  size_t buffer_size;
  
  if (this->mem_buffer_ != (output_char_conflict *)0x0) {
    operator_delete__(this->mem_buffer_);
    this->mem_buffer_ = (output_char_conflict *)0x0;
  }
  this->buffer_[0] = '\0';
  buffer_size = (long)end + (1 - (long)begin);
  if (buffer_size < 0xb) {
    buffer_size = 10;
    buffer = this;
  }
  else {
    buffer = (basic_stackstring<char,_wchar_t,_10UL> *)operator_new__(buffer_size);
    this->mem_buffer_ = (output_char_conflict *)buffer;
  }
  pcVar2 = basic_convert<char,wchar_t>(buffer->buffer_,buffer_size,begin,end);
  bVar1 = true;
  if (pcVar2 == (char *)0x0) {
    if (this->mem_buffer_ != (output_char_conflict *)0x0) {
      operator_delete__(this->mem_buffer_);
      this->mem_buffer_ = (output_char_conflict *)0x0;
    }
    this->buffer_[0] = '\0';
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool convert(input_char const *begin,input_char const *end)
    {
        clear();

        size_t space = get_space(sizeof(input_char),sizeof(output_char),end - begin) + 1;
        if(space <= buffer_size) {
            if(basic_convert(buffer_,buffer_size,begin,end))
                return true;
            clear();
            return false;
        }
        else {
            mem_buffer_ = new output_char[space];
            if(!basic_convert(mem_buffer_,space,begin,end)) {
                clear();
                return false;
            }
            return true;
        }

    }